

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_data.hpp
# Opt level: O1

void duckdb::ArrowEnumData<int>::Initialize
               (ArrowAppendData *result,LogicalType *type,idx_t capacity)

{
  reference this;
  idx_t iVar1;
  type append_data;
  Vector *input;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true> enum_data;
  undefined1 local_50 [16];
  pointer pLStack_40;
  LogicalType local_38;
  
  this = vector<duckdb::ArrowBuffer,_true>::operator[](&result->arrow_buffers,1);
  ArrowBuffer::reserve(this,capacity << 2);
  LogicalType::LogicalType(&local_38,VARCHAR);
  iVar1 = EnumType::GetSize(type);
  local_50._8_8_ = (pointer)0x0;
  pLStack_40 = (pointer)0x0;
  ArrowAppender::InitializeChild
            ((ArrowAppender *)local_50,&local_38,iVar1,&result->options,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)(local_50 + 8));
  if (pLStack_40 != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_40);
  }
  LogicalType::~LogicalType(&local_38);
  append_data = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                ::operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                             *)local_50);
  input = EnumType::GetValuesInsertOrder(type);
  iVar1 = EnumType::GetSize(type);
  EnumAppendVector(append_data,input,iVar1);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
              *)&result->child_data,
             (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
              *)local_50);
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              local_50);
  return;
}

Assistant:

static void Initialize(ArrowAppendData &result, const LogicalType &type, idx_t capacity) {
		result.GetMainBuffer().reserve(capacity * sizeof(TGT));
		// construct the enum child data
		auto enum_data = ArrowAppender::InitializeChild(LogicalType::VARCHAR, EnumType::GetSize(type), result.options);
		EnumAppendVector(*enum_data, EnumType::GetValuesInsertOrder(type), EnumType::GetSize(type));
		result.child_data.push_back(std::move(enum_data));
	}